

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O0

ByteData256 *
cfd::core::TweakAddXonlyPubkey
          (ByteData256 *__return_storage_ptr__,SchnorrPubkey *pubkey,ByteData256 *tweak,bool *parity
          )

{
  pointer *__return_storage_ptr___00;
  int iVar1;
  secp256k1_context_struct *ctx_00;
  uchar *tweak32;
  undefined8 uVar2;
  ByteData256 *pBVar3;
  CfdError error_code;
  CfdException *this;
  undefined1 local_142 [8];
  secp256k1_xonly_pubkey tweak_key;
  undefined1 auStack_c8 [4];
  int ret;
  secp256k1_pubkey_conflict tweak_pubkey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_bytes;
  secp256k1_xonly_pubkey base_xonly_key;
  secp256k1_context_struct *ctx;
  bool *parity_local;
  ByteData256 *tweak_local;
  SchnorrPubkey *pubkey_local;
  
  pBVar3 = __return_storage_ptr__;
  ctx_00 = wally_get_secp_context();
  __return_storage_ptr___00 =
       &tweak_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  ParseXOnlyPubkey((secp256k1_xonly_pubkey *)__return_storage_ptr___00,pubkey);
  this = (CfdException *)(tweak_pubkey.data + 0x38);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,tweak);
  tweak_pubkey.data[0x28] = '\0';
  tweak_pubkey.data[0x29] = '\0';
  tweak_pubkey.data[0x2a] = '\0';
  tweak_pubkey.data[0x2b] = '\0';
  tweak_pubkey.data[0x2c] = '\0';
  tweak_pubkey.data[0x2d] = '\0';
  tweak_pubkey.data[0x2e] = '\0';
  tweak_pubkey.data[0x2f] = '\0';
  tweak_pubkey.data[0x30] = '\0';
  tweak_pubkey.data[0x31] = '\0';
  tweak_pubkey.data[0x32] = '\0';
  tweak_pubkey.data[0x33] = '\0';
  tweak_pubkey.data[0x34] = '\0';
  tweak_pubkey.data[0x35] = '\0';
  tweak_pubkey.data[0x36] = '\0';
  tweak_pubkey.data[0x37] = '\0';
  tweak_pubkey.data[0x18] = '\0';
  tweak_pubkey.data[0x19] = '\0';
  tweak_pubkey.data[0x1a] = '\0';
  tweak_pubkey.data[0x1b] = '\0';
  tweak_pubkey.data[0x1c] = '\0';
  tweak_pubkey.data[0x1d] = '\0';
  tweak_pubkey.data[0x1e] = '\0';
  tweak_pubkey.data[0x1f] = '\0';
  tweak_pubkey.data[0x20] = '\0';
  tweak_pubkey.data[0x21] = '\0';
  tweak_pubkey.data[0x22] = '\0';
  tweak_pubkey.data[0x23] = '\0';
  tweak_pubkey.data[0x24] = '\0';
  tweak_pubkey.data[0x25] = '\0';
  tweak_pubkey.data[0x26] = '\0';
  tweak_pubkey.data[0x27] = '\0';
  tweak_pubkey.data[8] = '\0';
  tweak_pubkey.data[9] = '\0';
  tweak_pubkey.data[10] = '\0';
  tweak_pubkey.data[0xb] = '\0';
  tweak_pubkey.data[0xc] = '\0';
  tweak_pubkey.data[0xd] = '\0';
  tweak_pubkey.data[0xe] = '\0';
  tweak_pubkey.data[0xf] = '\0';
  tweak_pubkey.data[0x10] = '\0';
  tweak_pubkey.data[0x11] = '\0';
  tweak_pubkey.data[0x12] = '\0';
  tweak_pubkey.data[0x13] = '\0';
  tweak_pubkey.data[0x14] = '\0';
  tweak_pubkey.data[0x15] = '\0';
  tweak_pubkey.data[0x16] = '\0';
  tweak_pubkey.data[0x17] = '\0';
  auStack_c8[0] = '\0';
  auStack_c8[1] = '\0';
  auStack_c8[2] = '\0';
  auStack_c8[3] = '\0';
  ret._0_1_ = '\0';
  ret._1_1_ = '\0';
  ret._2_1_ = '\0';
  ret._3_1_ = '\0';
  tweak_pubkey.data[0] = '\0';
  tweak_pubkey.data[1] = '\0';
  tweak_pubkey.data[2] = '\0';
  tweak_pubkey.data[3] = '\0';
  tweak_pubkey.data[4] = '\0';
  tweak_pubkey.data[5] = '\0';
  tweak_pubkey.data[6] = '\0';
  tweak_pubkey.data[7] = '\0';
  tweak32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x49b783);
  iVar1 = secp256k1_xonly_pubkey_tweak_add
                    (ctx_00,(secp256k1_pubkey_conflict *)auStack_c8,
                     (secp256k1_xonly_pubkey *)__return_storage_ptr___00,tweak32);
  if (iVar1 != 1) {
    tweak_key.data[0x38] = '\x01';
    uVar2 = __cxa_allocate_exception(0x30);
    error_code = (CfdError)((ulong)pBVar3 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(tweak_key.data + 0x3a),"Could not tweak add xonly pubkey",
               (allocator *)(tweak_key.data + 0x39));
    CfdException::CfdException(this,error_code,(string *)__return_storage_ptr__);
    tweak_key.data[0x38] = '\0';
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  GetXOnlyPubkeyFromPubkey
            ((secp256k1_xonly_pubkey *)local_142,(secp256k1_pubkey_conflict *)auStack_c8,parity);
  ConvertSchnorrPubkey(__return_storage_ptr__,(secp256k1_xonly_pubkey *)local_142);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            (&__return_storage_ptr__->data_);
  return pBVar3;
}

Assistant:

ByteData256 TweakAddXonlyPubkey(
    const SchnorrPubkey& pubkey, const ByteData256& tweak, bool* parity) {
  auto ctx = wally_get_secp_context();
  auto base_xonly_key = ParseXOnlyPubkey(pubkey);
  std::vector<uint8_t> tweak_bytes = tweak.GetBytes();
  secp256k1_pubkey tweak_pubkey;
  memset(&tweak_pubkey, 0, sizeof(tweak_pubkey));

  int ret = secp256k1_xonly_pubkey_tweak_add(
      ctx, &tweak_pubkey, &base_xonly_key, tweak_bytes.data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not tweak add xonly pubkey");
  }

  auto tweak_key = GetXOnlyPubkeyFromPubkey(tweak_pubkey, parity);
  return ConvertSchnorrPubkey(tweak_key);
}